

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  BaseNode *node_00;
  WorkToPhysMap *pWVar6;
  PhysToWorkMap *pPVar7;
  PhysToWorkMap *pPVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  RegGroup RVar12;
  Error EVar13;
  RABlock *pRVar14;
  BaseNode *pBVar15;
  RABlock *block;
  long lVar16;
  ulong unaff_RBP;
  InstNode *node_01;
  BaseCompiler *pBVar17;
  RALocalAllocator *this_00;
  ulong unaff_R12;
  InstNode *pIVar18;
  long lVar19;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  long lStack_88;
  ulong uStack_80;
  InstNode *pIStack_78;
  RALocalAllocator *pRStack_70;
  long lStack_68;
  code *pcStack_60;
  ulong local_50;
  RALocalAllocator *local_48;
  InstNode *local_40;
  InstNode *local_38;
  
  lVar19 = *(long *)(node + 0x20);
  node_01 = (InstNode *)(ulong)*(uint *)(lVar19 + 0x10);
  if (node_01 != (InstNode *)0x0) {
    local_48 = (RALocalAllocator *)&this->_curAssignment;
    lVar16 = lVar19 + 0x54;
    pIVar18 = (InstNode *)0x0;
    this_00 = this;
    local_40 = node_01;
    local_38 = node;
    do {
      if ((InstNode *)(ulong)*(uint *)(lVar19 + 0x10) <= pIVar18) {
        pcStack_60 = (code *)0x123a70;
        spillAfterAllocation();
LAB_00123a70:
        pcStack_60 = (code *)0x123a75;
        spillAfterAllocation();
LAB_00123a75:
        pcStack_60 = (code *)0x123a7a;
        spillAfterAllocation();
LAB_00123a7a:
        pcStack_60 = (code *)0x123a7f;
        spillAfterAllocation();
LAB_00123a7f:
        pcStack_60 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node_01;
        lStack_88 = lVar16;
        uStack_80 = unaff_R12;
        pIStack_78 = pIVar18;
        pRStack_70 = this;
        lStack_68 = lVar19;
        pcStack_60 = (code *)unaff_RBP;
        if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
           (EVar13 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true),
           EVar13 != 0)) {
          return EVar13;
        }
        EVar13 = allocInst(this_00,node_01);
        if (EVar13 != 0) {
          return EVar13;
        }
        uVar4 = *(uint *)(block + 0xb8);
        if ((ulong)uVar4 == 0xffffffff) {
          pRVar14 = block + 0xbc;
LAB_00123b18:
          EVar13 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar14);
          if (EVar13 != 0) {
            return EVar13;
          }
          if (*(long *)(block + 200) == 0) {
            EVar13 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar13 != 0) {
              return EVar13;
            }
          }
          else {
            node_00 = *(BaseNode **)this_00->_pass->_extraBlock;
            pBVar15 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,node_00);
            pWVar6 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar6,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar13 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
            if (EVar13 != 0) {
              return EVar13;
            }
            pBVar17 = this_00->_cc;
            if ((pBVar17->super_BaseBuilder)._cursor != node_00) {
              if ((uint)(byte)node_01[0x13] <= (byte)node_01[0x12] - 1) goto LAB_00123cba;
              lVar19 = (ulong)((byte)node_01[0x12] - 1) * 0x10;
              if ((*(uint *)(node_01 + lVar19 + 0x40) & 7) != 5) goto LAB_00123cbf;
              (*(pBVar17->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_b0);
              uStack_a0 = *(undefined8 *)(node_01 + lVar19 + 0x40);
              uStack_98 = *(undefined8 *)(node_01 + lVar19 + 0x48);
              *(undefined4 *)(node_01 + lVar19 + 0x40) = uStack_b0;
              *(undefined4 *)(node_01 + lVar19 + 0x44) = uStack_ac;
              *(undefined4 *)(node_01 + lVar19 + 0x48) = uStack_a8;
              *(undefined4 *)(node_01 + lVar19 + 0x4c) = uStack_a4;
              node_01[0x34] = (InstNode)((byte)node_01[0x34] & 0xef);
              EVar13 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (EVar13 != 0) {
                return EVar13;
              }
              pBVar17 = this_00->_cc;
              (pBVar17->super_BaseBuilder)._cursor = node_00;
              (*(pBVar17->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar17,&uStack_b0);
              pBVar17 = this_00->_cc;
            }
            (pBVar17->super_BaseBuilder)._cursor = pBVar15;
            pWVar6 = (this_00->_curAssignment)._workToPhysMap;
            pPVar7 = (this_00->_curAssignment)._physToWorkMap;
            pPVar8 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar8;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar6;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar7;
            lVar19 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar19;
              puVar9 = *ppuVar1;
              puVar10 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar19;
              puVar11 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar19;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar11;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar19;
              *ppuVar1 = puVar9;
              ppuVar1[1] = puVar10;
              lVar19 = lVar19 + 2;
            } while (lVar19 != 4);
          }
          EVar13 = 0;
        }
        else {
          if (uVar4 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar14 = (RABlock *)((ulong)uVar4 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_00123b18;
          }
          allocBranch();
LAB_00123cba:
          allocBranch();
LAB_00123cbf:
          EVar13 = 3;
        }
        return EVar13;
      }
      if ((*(byte *)(lVar16 + 2) & 2) != 0) {
        uVar4 = *(uint *)(lVar16 + -8);
        unaff_R12 = (ulong)uVar4;
        if (*(uint *)&this->_pass->field_0x148 <= uVar4) goto LAB_00123a70;
        lVar5 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar5 + 0x4a) != -1) goto LAB_00123a4a;
        if ((this->_curAssignment)._layout.workCount <= uVar4) goto LAB_00123a75;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00123a4a;
        RVar12 = *(RegGroup *)(lVar5 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = (BaseNode *)local_38;
        if (0x1f < bVar3) goto LAB_00123a7a;
        RVar12 = RVar12 & kMaxValue;
        if (RVar12 < kPC) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar12] >>
               (bVar3 & 0x1f) & 1) != 0) {
            pcStack_60 = (code *)0x123a2d;
            local_50 = (ulong)RVar12;
            EVar13 = onSaveReg(this,RVar12,uVar4,(uint)bVar3);
            RVar12 = (RegGroup)local_50;
            if (EVar13 != 0) {
              return EVar13;
            }
          }
          pcStack_60 = (code *)0x123a45;
          this_00 = local_48;
          RAAssignment::unassign((RAAssignment *)local_48,RVar12,uVar4,(uint)bVar3);
          node_01 = local_40;
          goto LAB_00123a4a;
        }
        goto LAB_00123a7f;
      }
LAB_00123a4a:
      pIVar18 = pIVar18 + 1;
      lVar16 = lVar16 + 0x20;
    } while (node_01 != pIVar18);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have home-id and are last in this basic block.
  // This prevents saving these regs in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        RegGroup group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}